

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools.cpp
# Opt level: O2

int __thiscall GPIO::Tools::AutoFile::close(AutoFile *this,int __fd)

{
  int in_EAX;
  ToolsError *this_00;
  int *piVar1;
  char *__rhs;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (-1 < this->m_fd) {
    in_EAX = ::close(this->m_fd);
    if (in_EAX < 0) {
      this_00 = (ToolsError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"cannot close file: ",&local_59);
      piVar1 = __errno_location();
      __rhs = strerror(*piVar1);
      std::operator+(&local_38,&local_58,__rhs);
      ToolsError::runtime_error(this_00,&local_38);
      __cxa_throw(this_00,&ToolsError::typeinfo,std::runtime_error::~runtime_error);
    }
    this->m_fd = -1;
  }
  return in_EAX;
}

Assistant:

void AutoFile::close()
{
    if (m_fd < 0) return;
    if (::close(m_fd) < 0) throw ToolsError(std::string("cannot close file: ") + std::strerror(errno));
    m_fd = -1;
}